

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpf_common_sse2.h
# Opt level: O2

void transpose16x8_8x16_sse2
               (__m128i *x0,__m128i *x1,__m128i *x2,__m128i *x3,__m128i *x4,__m128i *x5,__m128i *x6,
               __m128i *x7,__m128i *x8,__m128i *x9,__m128i *x10,__m128i *x11,__m128i *x12,
               __m128i *x13,__m128i *x14,__m128i *x15,__m128i *d0,__m128i *d1,__m128i *d2,
               __m128i *d3,__m128i *d4,__m128i *d5,__m128i *d6,__m128i *d7)

{
  __m128i alVar1;
  __m128i alVar2;
  __m128i alVar3;
  __m128i alVar4;
  undefined1 auVar5 [14];
  undefined1 auVar6 [12];
  unkbyte10 Var7;
  undefined1 auVar8 [14];
  undefined1 auVar9 [12];
  unkbyte10 Var10;
  undefined1 auVar11 [14];
  undefined1 auVar12 [12];
  unkbyte10 Var13;
  undefined1 auVar14 [14];
  undefined1 auVar15 [12];
  unkbyte10 Var16;
  undefined1 auVar17 [14];
  undefined1 auVar18 [12];
  unkbyte10 Var19;
  undefined1 auVar20 [14];
  undefined1 auVar21 [12];
  unkbyte10 Var22;
  undefined1 auVar23 [14];
  undefined1 auVar24 [12];
  unkbyte10 Var25;
  undefined1 auVar26 [14];
  undefined1 auVar27 [12];
  unkbyte10 Var28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  longlong lVar33;
  undefined4 uVar34;
  undefined1 auVar36 [16];
  undefined4 uVar45;
  undefined1 auVar47 [16];
  undefined4 uVar56;
  undefined1 auVar58 [16];
  undefined4 uVar67;
  undefined1 auVar69 [16];
  undefined1 auVar78 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar101 [16];
  undefined1 auVar108 [16];
  undefined1 auVar112 [16];
  undefined1 auVar115 [16];
  undefined1 auVar119 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar37 [16];
  undefined1 auVar35 [12];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar44 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar48 [16];
  undefined1 auVar46 [12];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar55 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar59 [16];
  undefined1 auVar57 [12];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar66 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar70 [16];
  undefined1 auVar68 [12];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  
  alVar1 = *x0;
  auVar43._0_14_ = alVar1._0_14_;
  auVar43[0xe] = alVar1[0]._7_1_;
  auVar43[0xf] = *(undefined1 *)((long)*x1 + 7);
  auVar42._14_2_ = auVar43._14_2_;
  auVar42._0_13_ = alVar1._0_13_;
  auVar42[0xd] = *(undefined1 *)((long)*x1 + 6);
  auVar41._13_3_ = auVar42._13_3_;
  auVar41._0_12_ = alVar1._0_12_;
  auVar41[0xc] = alVar1[0]._6_1_;
  auVar40._12_4_ = auVar41._12_4_;
  auVar40._0_11_ = alVar1._0_11_;
  auVar40[0xb] = *(undefined1 *)((long)*x1 + 5);
  auVar39._11_5_ = auVar40._11_5_;
  auVar39._0_10_ = alVar1._0_10_;
  auVar39[10] = alVar1[0]._5_1_;
  auVar38._10_6_ = auVar39._10_6_;
  auVar38._0_9_ = alVar1._0_9_;
  auVar38[9] = *(undefined1 *)((long)*x1 + 4);
  auVar37._9_7_ = auVar38._9_7_;
  auVar37._0_8_ = alVar1[0];
  auVar37[8] = alVar1[0]._4_1_;
  Var7 = CONCAT91(CONCAT81(auVar37._8_8_,*(undefined1 *)((long)*x1 + 3)),alVar1[0]._3_1_);
  auVar6._2_10_ = Var7;
  auVar6[1] = *(undefined1 *)((long)*x1 + 2);
  auVar6[0] = alVar1[0]._2_1_;
  auVar5._2_12_ = auVar6;
  auVar5[1] = *(undefined1 *)((long)*x1 + 1);
  auVar5[0] = alVar1[0]._1_1_;
  auVar36._0_2_ = CONCAT11((char)(*x1)[0],(char)alVar1[0]);
  auVar36._2_14_ = auVar5;
  alVar1 = *x2;
  auVar84._0_14_ = alVar1._0_14_;
  auVar84[0xe] = alVar1[0]._7_1_;
  auVar84[0xf] = *(undefined1 *)((long)*x3 + 7);
  auVar83._14_2_ = auVar84._14_2_;
  auVar83._0_13_ = alVar1._0_13_;
  auVar83[0xd] = *(undefined1 *)((long)*x3 + 6);
  auVar82._13_3_ = auVar83._13_3_;
  auVar82._0_12_ = alVar1._0_12_;
  auVar82[0xc] = alVar1[0]._6_1_;
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._0_11_ = alVar1._0_11_;
  auVar81[0xb] = *(undefined1 *)((long)*x3 + 5);
  auVar80._11_5_ = auVar81._11_5_;
  auVar80._0_10_ = alVar1._0_10_;
  auVar80[10] = alVar1[0]._5_1_;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._0_9_ = alVar1._0_9_;
  auVar79[9] = *(undefined1 *)((long)*x3 + 4);
  auVar78._9_7_ = auVar79._9_7_;
  auVar78._0_8_ = alVar1[0];
  auVar78[8] = alVar1[0]._4_1_;
  Var10 = CONCAT91(CONCAT81(auVar78._8_8_,*(undefined1 *)((long)*x3 + 3)),alVar1[0]._3_1_);
  auVar9._2_10_ = Var10;
  auVar9[1] = *(undefined1 *)((long)*x3 + 2);
  auVar9[0] = alVar1[0]._2_1_;
  auVar8._2_12_ = auVar9;
  auVar8[1] = *(undefined1 *)((long)*x3 + 1);
  auVar8[0] = alVar1[0]._1_1_;
  alVar2 = *x4;
  auVar54._0_14_ = alVar2._0_14_;
  auVar54[0xe] = alVar2[0]._7_1_;
  auVar54[0xf] = *(undefined1 *)((long)*x5 + 7);
  auVar53._14_2_ = auVar54._14_2_;
  auVar53._0_13_ = alVar2._0_13_;
  auVar53[0xd] = *(undefined1 *)((long)*x5 + 6);
  auVar52._13_3_ = auVar53._13_3_;
  auVar52._0_12_ = alVar2._0_12_;
  auVar52[0xc] = alVar2[0]._6_1_;
  auVar51._12_4_ = auVar52._12_4_;
  auVar51._0_11_ = alVar2._0_11_;
  auVar51[0xb] = *(undefined1 *)((long)*x5 + 5);
  auVar50._11_5_ = auVar51._11_5_;
  auVar50._0_10_ = alVar2._0_10_;
  auVar50[10] = alVar2[0]._5_1_;
  auVar49._10_6_ = auVar50._10_6_;
  auVar49._0_9_ = alVar2._0_9_;
  auVar49[9] = *(undefined1 *)((long)*x5 + 4);
  auVar48._9_7_ = auVar49._9_7_;
  auVar48._0_8_ = alVar2[0];
  auVar48[8] = alVar2[0]._4_1_;
  Var13 = CONCAT91(CONCAT81(auVar48._8_8_,*(undefined1 *)((long)*x5 + 3)),alVar2[0]._3_1_);
  auVar12._2_10_ = Var13;
  auVar12[1] = *(undefined1 *)((long)*x5 + 2);
  auVar12[0] = alVar2[0]._2_1_;
  auVar11._2_12_ = auVar12;
  auVar11[1] = *(undefined1 *)((long)*x5 + 1);
  auVar11[0] = alVar2[0]._1_1_;
  auVar47._0_2_ = CONCAT11((char)(*x5)[0],(char)alVar2[0]);
  auVar47._2_14_ = auVar11;
  alVar2 = *x6;
  auVar92._0_14_ = alVar2._0_14_;
  auVar92[0xe] = alVar2[0]._7_1_;
  auVar92[0xf] = *(undefined1 *)((long)*x7 + 7);
  auVar91._14_2_ = auVar92._14_2_;
  auVar91._0_13_ = alVar2._0_13_;
  auVar91[0xd] = *(undefined1 *)((long)*x7 + 6);
  auVar90._13_3_ = auVar91._13_3_;
  auVar90._0_12_ = alVar2._0_12_;
  auVar90[0xc] = alVar2[0]._6_1_;
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._0_11_ = alVar2._0_11_;
  auVar89[0xb] = *(undefined1 *)((long)*x7 + 5);
  auVar88._11_5_ = auVar89._11_5_;
  auVar88._0_10_ = alVar2._0_10_;
  auVar88[10] = alVar2[0]._5_1_;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._0_9_ = alVar2._0_9_;
  auVar87[9] = *(undefined1 *)((long)*x7 + 4);
  auVar86._9_7_ = auVar87._9_7_;
  auVar86._0_8_ = alVar2[0];
  auVar86[8] = alVar2[0]._4_1_;
  Var16 = CONCAT91(CONCAT81(auVar86._8_8_,*(undefined1 *)((long)*x7 + 3)),alVar2[0]._3_1_);
  auVar15._2_10_ = Var16;
  auVar15[1] = *(undefined1 *)((long)*x7 + 2);
  auVar15[0] = alVar2[0]._2_1_;
  auVar14._2_12_ = auVar15;
  auVar14[1] = *(undefined1 *)((long)*x7 + 1);
  auVar14[0] = alVar2[0]._1_1_;
  alVar3 = *x8;
  auVar65._0_14_ = alVar3._0_14_;
  auVar65[0xe] = alVar3[0]._7_1_;
  auVar65[0xf] = *(undefined1 *)((long)*x9 + 7);
  auVar64._14_2_ = auVar65._14_2_;
  auVar64._0_13_ = alVar3._0_13_;
  auVar64[0xd] = *(undefined1 *)((long)*x9 + 6);
  auVar63._13_3_ = auVar64._13_3_;
  auVar63._0_12_ = alVar3._0_12_;
  auVar63[0xc] = alVar3[0]._6_1_;
  auVar62._12_4_ = auVar63._12_4_;
  auVar62._0_11_ = alVar3._0_11_;
  auVar62[0xb] = *(undefined1 *)((long)*x9 + 5);
  auVar61._11_5_ = auVar62._11_5_;
  auVar61._0_10_ = alVar3._0_10_;
  auVar61[10] = alVar3[0]._5_1_;
  auVar60._10_6_ = auVar61._10_6_;
  auVar60._0_9_ = alVar3._0_9_;
  auVar60[9] = *(undefined1 *)((long)*x9 + 4);
  auVar59._9_7_ = auVar60._9_7_;
  auVar59._0_8_ = alVar3[0];
  auVar59[8] = alVar3[0]._4_1_;
  Var19 = CONCAT91(CONCAT81(auVar59._8_8_,*(undefined1 *)((long)*x9 + 3)),alVar3[0]._3_1_);
  auVar18._2_10_ = Var19;
  auVar18[1] = *(undefined1 *)((long)*x9 + 2);
  auVar18[0] = alVar3[0]._2_1_;
  auVar17._2_12_ = auVar18;
  auVar17[1] = *(undefined1 *)((long)*x9 + 1);
  auVar17[0] = alVar3[0]._1_1_;
  auVar58._0_2_ = CONCAT11((char)(*x9)[0],(char)alVar3[0]);
  auVar58._2_14_ = auVar17;
  alVar3 = *x10;
  auVar100._0_14_ = alVar3._0_14_;
  auVar100[0xe] = alVar3[0]._7_1_;
  auVar100[0xf] = *(undefined1 *)((long)*x11 + 7);
  auVar99._14_2_ = auVar100._14_2_;
  auVar99._0_13_ = alVar3._0_13_;
  auVar99[0xd] = *(undefined1 *)((long)*x11 + 6);
  auVar98._13_3_ = auVar99._13_3_;
  auVar98._0_12_ = alVar3._0_12_;
  auVar98[0xc] = alVar3[0]._6_1_;
  auVar97._12_4_ = auVar98._12_4_;
  auVar97._0_11_ = alVar3._0_11_;
  auVar97[0xb] = *(undefined1 *)((long)*x11 + 5);
  auVar96._11_5_ = auVar97._11_5_;
  auVar96._0_10_ = alVar3._0_10_;
  auVar96[10] = alVar3[0]._5_1_;
  auVar95._10_6_ = auVar96._10_6_;
  auVar95._0_9_ = alVar3._0_9_;
  auVar95[9] = *(undefined1 *)((long)*x11 + 4);
  auVar94._9_7_ = auVar95._9_7_;
  auVar94._0_8_ = alVar3[0];
  auVar94[8] = alVar3[0]._4_1_;
  Var22 = CONCAT91(CONCAT81(auVar94._8_8_,*(undefined1 *)((long)*x11 + 3)),alVar3[0]._3_1_);
  auVar21._2_10_ = Var22;
  auVar21[1] = *(undefined1 *)((long)*x11 + 2);
  auVar21[0] = alVar3[0]._2_1_;
  auVar20._2_12_ = auVar21;
  auVar20[1] = *(undefined1 *)((long)*x11 + 1);
  auVar20[0] = alVar3[0]._1_1_;
  alVar4 = *x12;
  auVar76._0_14_ = alVar4._0_14_;
  auVar76[0xe] = alVar4[0]._7_1_;
  auVar76[0xf] = *(undefined1 *)((long)*x13 + 7);
  auVar75._14_2_ = auVar76._14_2_;
  auVar75._0_13_ = alVar4._0_13_;
  auVar75[0xd] = *(undefined1 *)((long)*x13 + 6);
  auVar74._13_3_ = auVar75._13_3_;
  auVar74._0_12_ = alVar4._0_12_;
  auVar74[0xc] = alVar4[0]._6_1_;
  auVar73._12_4_ = auVar74._12_4_;
  auVar73._0_11_ = alVar4._0_11_;
  auVar73[0xb] = *(undefined1 *)((long)*x13 + 5);
  auVar72._11_5_ = auVar73._11_5_;
  auVar72._0_10_ = alVar4._0_10_;
  auVar72[10] = alVar4[0]._5_1_;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._0_9_ = alVar4._0_9_;
  auVar71[9] = *(undefined1 *)((long)*x13 + 4);
  auVar70._9_7_ = auVar71._9_7_;
  auVar70._0_8_ = alVar4[0];
  auVar70[8] = alVar4[0]._4_1_;
  Var25 = CONCAT91(CONCAT81(auVar70._8_8_,*(undefined1 *)((long)*x13 + 3)),alVar4[0]._3_1_);
  auVar24._2_10_ = Var25;
  auVar24[1] = *(undefined1 *)((long)*x13 + 2);
  auVar24[0] = alVar4[0]._2_1_;
  auVar23._2_12_ = auVar24;
  auVar23[1] = *(undefined1 *)((long)*x13 + 1);
  auVar23[0] = alVar4[0]._1_1_;
  auVar69._0_2_ = CONCAT11((char)(*x13)[0],(char)alVar4[0]);
  auVar69._2_14_ = auVar23;
  alVar4 = *x14;
  lVar33 = (*x15)[0];
  auVar107._0_14_ = alVar4._0_14_;
  auVar107[0xe] = alVar4[0]._7_1_;
  auVar107[0xf] = *(undefined1 *)((long)*x15 + 7);
  auVar106._14_2_ = auVar107._14_2_;
  auVar106._0_13_ = alVar4._0_13_;
  auVar106[0xd] = *(undefined1 *)((long)*x15 + 6);
  auVar105._13_3_ = auVar106._13_3_;
  auVar105._0_12_ = alVar4._0_12_;
  auVar105[0xc] = alVar4[0]._6_1_;
  auVar104._12_4_ = auVar105._12_4_;
  auVar104._0_11_ = alVar4._0_11_;
  auVar104[0xb] = *(undefined1 *)((long)*x15 + 5);
  auVar103._11_5_ = auVar104._11_5_;
  auVar103._0_10_ = alVar4._0_10_;
  auVar103[10] = alVar4[0]._5_1_;
  auVar102._10_6_ = auVar103._10_6_;
  auVar102._0_9_ = alVar4._0_9_;
  auVar102[9] = *(undefined1 *)((long)*x15 + 4);
  auVar101._9_7_ = auVar102._9_7_;
  auVar101._0_8_ = alVar4[0];
  auVar101[8] = alVar4[0]._4_1_;
  Var28 = CONCAT91(CONCAT81(auVar101._8_8_,*(undefined1 *)((long)*x15 + 3)),alVar4[0]._3_1_);
  auVar27._2_10_ = Var28;
  auVar27[1] = *(undefined1 *)((long)*x15 + 2);
  auVar27[0] = alVar4[0]._2_1_;
  auVar26._2_12_ = auVar27;
  auVar26[1] = *(undefined1 *)((long)*x15 + 1);
  auVar26[0] = alVar4[0]._1_1_;
  auVar111._0_12_ = auVar36._0_12_;
  auVar111._12_2_ = (short)Var7;
  auVar111._14_2_ = (short)Var10;
  auVar110._12_4_ = auVar111._12_4_;
  auVar110._0_10_ = auVar36._0_10_;
  auVar110._10_2_ = auVar9._0_2_;
  auVar109._10_6_ = auVar110._10_6_;
  auVar109._0_8_ = auVar36._0_8_;
  auVar109._8_2_ = auVar6._0_2_;
  auVar29._4_8_ = auVar109._8_8_;
  auVar29._2_2_ = auVar8._0_2_;
  auVar29._0_2_ = auVar5._0_2_;
  auVar108._0_4_ = CONCAT22(CONCAT11((char)(*x3)[0],(char)alVar1[0]),auVar36._0_2_);
  auVar108._4_12_ = auVar29;
  auVar114._0_12_ = auVar47._0_12_;
  auVar114._12_2_ = (short)Var13;
  auVar114._14_2_ = (short)Var16;
  auVar113._12_4_ = auVar114._12_4_;
  auVar113._0_10_ = auVar47._0_10_;
  auVar113._10_2_ = auVar15._0_2_;
  auVar112._10_6_ = auVar113._10_6_;
  auVar112._0_8_ = auVar47._0_8_;
  auVar112._8_2_ = auVar12._0_2_;
  auVar30._4_8_ = auVar112._8_8_;
  auVar30._2_2_ = auVar14._0_2_;
  auVar30._0_2_ = auVar11._0_2_;
  auVar118._0_12_ = auVar58._0_12_;
  auVar118._12_2_ = (short)Var19;
  auVar118._14_2_ = (short)Var22;
  auVar117._12_4_ = auVar118._12_4_;
  auVar117._0_10_ = auVar58._0_10_;
  auVar117._10_2_ = auVar21._0_2_;
  auVar116._10_6_ = auVar117._10_6_;
  auVar116._0_8_ = auVar58._0_8_;
  auVar116._8_2_ = auVar18._0_2_;
  auVar31._4_8_ = auVar116._8_8_;
  auVar31._2_2_ = auVar20._0_2_;
  auVar31._0_2_ = auVar17._0_2_;
  auVar115._0_4_ = CONCAT22(CONCAT11((char)(*x11)[0],(char)alVar3[0]),auVar58._0_2_);
  auVar115._4_12_ = auVar31;
  auVar121._0_12_ = auVar69._0_12_;
  auVar121._12_2_ = (short)Var25;
  auVar121._14_2_ = (short)Var28;
  auVar120._12_4_ = auVar121._12_4_;
  auVar120._0_10_ = auVar69._0_10_;
  auVar120._10_2_ = auVar27._0_2_;
  auVar119._10_6_ = auVar120._10_6_;
  auVar119._0_8_ = auVar69._0_8_;
  auVar119._8_2_ = auVar24._0_2_;
  auVar32._4_8_ = auVar119._8_8_;
  auVar32._2_2_ = auVar26._0_2_;
  auVar32._0_2_ = auVar23._0_2_;
  auVar122._0_8_ = auVar108._0_8_;
  auVar122._8_4_ = auVar29._0_4_;
  auVar122._12_4_ = auVar30._0_4_;
  auVar123._0_8_ = auVar115._0_8_;
  auVar123._8_4_ = auVar31._0_4_;
  auVar123._12_4_ = auVar32._0_4_;
  (*d0)[0] = CONCAT44(CONCAT22(CONCAT11((char)(*x7)[0],(char)alVar2[0]),auVar47._0_2_),
                      auVar108._0_4_);
  (*d0)[1] = CONCAT44(CONCAT22(CONCAT11((char)lVar33,(char)alVar4[0]),auVar69._0_2_),auVar115._0_4_)
  ;
  (*d1)[0] = auVar122._8_8_;
  (*d1)[1] = auVar123._8_8_;
  *(int *)*d2 = auVar109._8_4_;
  *(int *)((long)*d2 + 4) = auVar112._8_4_;
  *(int *)(*d2 + 1) = auVar116._8_4_;
  *(int *)((long)*d2 + 0xc) = auVar119._8_4_;
  *(undefined4 *)(*d3 + 1) = auVar110._12_4_;
  *(undefined4 *)((long)*d3 + 0xc) = auVar113._12_4_;
  *(undefined4 *)d3[1] = auVar117._12_4_;
  *(undefined4 *)((long)d3[1] + 4) = auVar120._12_4_;
  uVar34 = CONCAT22(auVar78._8_2_,auVar37._8_2_);
  auVar35._0_8_ = CONCAT26(auVar80._10_2_,CONCAT24(auVar39._10_2_,uVar34));
  auVar35._8_2_ = auVar41._12_2_;
  auVar35._10_2_ = auVar82._12_2_;
  auVar44._12_2_ = auVar42._14_2_;
  auVar44._0_12_ = auVar35;
  auVar44._14_2_ = auVar83._14_2_;
  uVar45 = CONCAT22(auVar86._8_2_,auVar48._8_2_);
  auVar46._0_8_ = CONCAT26(auVar88._10_2_,CONCAT24(auVar50._10_2_,uVar45));
  auVar46._8_2_ = auVar52._12_2_;
  auVar46._10_2_ = auVar90._12_2_;
  auVar55._12_2_ = auVar53._14_2_;
  auVar55._0_12_ = auVar46;
  auVar55._14_2_ = auVar91._14_2_;
  uVar56 = CONCAT22(auVar94._8_2_,auVar59._8_2_);
  auVar57._0_8_ = CONCAT26(auVar96._10_2_,CONCAT24(auVar61._10_2_,uVar56));
  auVar57._8_2_ = auVar63._12_2_;
  auVar57._10_2_ = auVar98._12_2_;
  auVar66._12_2_ = auVar64._14_2_;
  auVar66._0_12_ = auVar57;
  auVar66._14_2_ = auVar99._14_2_;
  uVar67 = CONCAT22(auVar101._8_2_,auVar70._8_2_);
  auVar68._0_8_ = CONCAT26(auVar103._10_2_,CONCAT24(auVar72._10_2_,uVar67));
  auVar68._8_2_ = auVar74._12_2_;
  auVar68._10_2_ = auVar105._12_2_;
  auVar77._12_2_ = auVar75._14_2_;
  auVar77._0_12_ = auVar68;
  auVar77._14_2_ = auVar106._14_2_;
  auVar85._8_4_ = (int)((ulong)auVar35._0_8_ >> 0x20);
  auVar85._0_8_ = auVar35._0_8_;
  auVar85._12_4_ = (int)((ulong)auVar46._0_8_ >> 0x20);
  auVar93._8_4_ = (int)((ulong)auVar57._0_8_ >> 0x20);
  auVar93._0_8_ = auVar57._0_8_;
  auVar93._12_4_ = (int)((ulong)auVar68._0_8_ >> 0x20);
  (*d4)[0] = CONCAT44(uVar45,uVar34);
  (*d4)[1] = CONCAT44(uVar67,uVar56);
  (*d5)[0] = auVar85._8_8_;
  (*d5)[1] = auVar93._8_8_;
  *(int *)*d6 = auVar35._8_4_;
  *(int *)((long)*d6 + 4) = auVar46._8_4_;
  *(int *)(*d6 + 1) = auVar57._8_4_;
  *(int *)((long)*d6 + 0xc) = auVar68._8_4_;
  *(int *)(*d7 + 1) = auVar44._12_4_;
  *(int *)((long)*d7 + 0xc) = auVar55._12_4_;
  *(int *)d7[1] = auVar66._12_4_;
  *(int *)((long)d7[1] + 4) = auVar77._12_4_;
  return;
}

Assistant:

static inline void transpose16x8_8x16_sse2(
    __m128i *x0, __m128i *x1, __m128i *x2, __m128i *x3, __m128i *x4,
    __m128i *x5, __m128i *x6, __m128i *x7, __m128i *x8, __m128i *x9,
    __m128i *x10, __m128i *x11, __m128i *x12, __m128i *x13, __m128i *x14,
    __m128i *x15, __m128i *d0, __m128i *d1, __m128i *d2, __m128i *d3,
    __m128i *d4, __m128i *d5, __m128i *d6, __m128i *d7) {
  __m128i w0, w1, w2, w3, w4, w5, w6, w7, w8, w9;
  __m128i w10, w11, w12, w13, w14, w15;

  w0 = _mm_unpacklo_epi8(*x0, *x1);
  w1 = _mm_unpacklo_epi8(*x2, *x3);
  w2 = _mm_unpacklo_epi8(*x4, *x5);
  w3 = _mm_unpacklo_epi8(*x6, *x7);

  w8 = _mm_unpacklo_epi8(*x8, *x9);
  w9 = _mm_unpacklo_epi8(*x10, *x11);
  w10 = _mm_unpacklo_epi8(*x12, *x13);
  w11 = _mm_unpacklo_epi8(*x14, *x15);

  w4 = _mm_unpacklo_epi16(w0, w1);
  w5 = _mm_unpacklo_epi16(w2, w3);
  w12 = _mm_unpacklo_epi16(w8, w9);
  w13 = _mm_unpacklo_epi16(w10, w11);

  w6 = _mm_unpacklo_epi32(w4, w5);
  w7 = _mm_unpackhi_epi32(w4, w5);
  w14 = _mm_unpacklo_epi32(w12, w13);
  w15 = _mm_unpackhi_epi32(w12, w13);

  // Store first 4-line result
  *d0 = _mm_unpacklo_epi64(w6, w14);
  *d1 = _mm_unpackhi_epi64(w6, w14);
  *d2 = _mm_unpacklo_epi64(w7, w15);
  *d3 = _mm_unpackhi_epi64(w7, w15);

  w4 = _mm_unpackhi_epi16(w0, w1);
  w5 = _mm_unpackhi_epi16(w2, w3);
  w12 = _mm_unpackhi_epi16(w8, w9);
  w13 = _mm_unpackhi_epi16(w10, w11);

  w6 = _mm_unpacklo_epi32(w4, w5);
  w7 = _mm_unpackhi_epi32(w4, w5);
  w14 = _mm_unpacklo_epi32(w12, w13);
  w15 = _mm_unpackhi_epi32(w12, w13);

  // Store second 4-line result
  *d4 = _mm_unpacklo_epi64(w6, w14);
  *d5 = _mm_unpackhi_epi64(w6, w14);
  *d6 = _mm_unpacklo_epi64(w7, w15);
  *d7 = _mm_unpackhi_epi64(w7, w15);
}